

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

int Fl::clipboard_contains(char *type)

{
  Atom AVar1;
  int iVar2;
  Fl_Window *pFVar3;
  unsigned_long uVar4;
  ulong uVar5;
  uchar *portion;
  unsigned_long count;
  int format;
  unsigned_long remaining;
  Atom actual;
  XEvent event;
  
  portion = (uchar *)0x0;
  pFVar3 = first_window();
  if (pFVar3 == (Fl_Window *)0x0) {
    return 0;
  }
  if (pFVar3->i == (Fl_X *)0x0) {
    return 0;
  }
  if (pFVar3->i->xid == 0) {
    return 0;
  }
  XConvertSelection(fl_display,CLIPBOARD,TARGETS);
  XFlush(fl_display);
  uVar5 = 0xffffffffffffffff;
  do {
    XNextEvent(fl_display,&event);
    if (event.type == 0x1f && event.xkey.time == 0) {
      return 0;
    }
    uVar5 = uVar5 + 1;
  } while ((uVar5 < 0x31) && (event.type != 0x1f));
  if (0x30 < uVar5) {
    return 0;
  }
  XGetWindowProperty(fl_display,event.xany.window,event.xkey.time,0,4000,0,0,&actual,&format,&count,
                     &remaining,&portion);
  if (actual != 4) {
    return 0;
  }
  iVar2 = strcmp(type,"text/plain");
  if (iVar2 == 0) {
    if (count != 0) {
      uVar4 = 0;
      do {
        AVar1 = *(Atom *)(portion + uVar4 * 8);
        iVar2 = 1;
        if ((((AVar1 == fl_Xatextplainutf) || (AVar1 == fl_Xatextplainutf2)) ||
            (AVar1 == fl_Xatextplain)) || (AVar1 == fl_XaUtf8String)) goto LAB_0018cde8;
        uVar4 = uVar4 + 1;
      } while (count != uVar4);
    }
  }
  else {
    iVar2 = strcmp(type,"image");
    if (iVar2 != 0) {
      iVar2 = 0;
      goto LAB_0018cde8;
    }
    if (count != 0) {
      uVar4 = 0;
      do {
        iVar2 = 1;
        if ((*(Atom *)(portion + uVar4 * 8) == fl_XaImageBmp) ||
           (*(Atom *)(portion + uVar4 * 8) == fl_XaImagePNG)) goto LAB_0018cde8;
        uVar4 = uVar4 + 1;
      } while (count != uVar4);
    }
  }
  iVar2 = 0;
LAB_0018cde8:
  XFree(portion);
  return iVar2;
}

Assistant:

int Fl::clipboard_contains(const char *type)
{
  XEvent event;
  Atom actual; int format; unsigned long count, remaining, i = 0;
  unsigned char* portion = NULL;
  Fl_Window *win = Fl::first_window();
  if (!win || !fl_xid(win)) return 0;
  XConvertSelection(fl_display, CLIPBOARD, TARGETS, CLIPBOARD, fl_xid(win), CurrentTime);
  XFlush(fl_display);
  do  { 
    XNextEvent(fl_display, &event); 
    if (event.type == SelectionNotify && event.xselection.property == None) return 0;
    i++; 
  }
  while (i < 50 && event.type != SelectionNotify);
  if (i >= 50) return 0;
  XGetWindowProperty(fl_display,
		     event.xselection.requestor,
		     event.xselection.property,
		     0, 4000, 0, 0,
		     &actual, &format, &count, &remaining, &portion);
  if (actual != XA_ATOM) return 0;
  Atom t;
  int retval = 0;
  if (strcmp(type, Fl::clipboard_plain_text) == 0) {
    for (i = 0; i<count; i++) { // searching for text data
      t = ((Atom*)portion)[i];
      if (t == fl_Xatextplainutf ||
	  t == fl_Xatextplainutf2 ||
	  t == fl_Xatextplain ||
	  t == fl_XaUtf8String) {
	retval = 1;
	break;
      }
    }	
  }
  else if (strcmp(type, Fl::clipboard_image) == 0) {
    for (i = 0; i<count; i++) { // searching for image data
      t = ((Atom*)portion)[i];
      if (t == fl_XaImageBmp || t == fl_XaImagePNG) {
	retval = 1;
	break;
      }
    }	
  }
  XFree(portion);
  return retval;
}